

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall FascodeUtil::msg::print(msg *this,MSG_TYPE msgtype,string *appname,string *message)

{
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)appname);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58," ",&local_79);
  std::__cxx11::string::string((string *)&local_78,(string *)message);
  print(this,msgtype,&local_38,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void msg::print(MSG_TYPE msgtype,std::string appname,std::string message){
        print(msgtype,appname," ",message);
    }